

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

void N_VDestroy_ManyVector(N_Vector v)

{
  long *plVar1;
  long lVar2;
  
  if (v != (N_Vector)0x0) {
    plVar1 = (long *)v->content;
    if (plVar1 != (long *)0x0) {
      if (((int)plVar1[3] == 1) && (plVar1[2] != 0)) {
        for (lVar2 = 0; lVar2 < *plVar1; lVar2 = lVar2 + 1) {
          N_VDestroy(*(undefined8 *)(plVar1[2] + lVar2 * 8));
          *(undefined8 *)(*(long *)((long)v->content + 0x10) + lVar2 * 8) = 0;
          plVar1 = (long *)v->content;
        }
      }
      free((void *)plVar1[2]);
      free(v->content);
      v->content = (void *)0x0;
    }
    free(v->ops);
    free(v);
    return;
  }
  return;
}

Assistant:

void MVAPPEND(N_VDestroy)(N_Vector v)
{
  SUNFunctionBegin(v->sunctx);

  sunindextype i;

  if (v == NULL) { return; }

  /* free content */
  if (v->content != NULL)
  {
    /* if subvectors are owned by v, then Destroy those */
    if ((MANYVECTOR_OWN_DATA(v) == SUNTRUE) && (MANYVECTOR_SUBVECS(v) != NULL))
    {
      for (i = 0; i < MANYVECTOR_NUM_SUBVECS(v); i++)
      {
        N_VDestroy(MANYVECTOR_SUBVEC(v, i));
        MANYVECTOR_SUBVEC(v, i) = NULL;
      }
    }

    /* free subvector array */
    free(MANYVECTOR_SUBVECS(v));
    MANYVECTOR_SUBVECS(v) = NULL;

#ifdef MANYVECTOR_BUILD_WITH_MPI
    /* free communicator */
    if (MANYVECTOR_COMM(v) != MPI_COMM_NULL)
    {
      SUNCheckMPICallVoid(MPI_Comm_free(&(MANYVECTOR_COMM(v))));
    }
    MANYVECTOR_COMM(v) = MPI_COMM_NULL;
#endif

    /* free content structure */
    free(v->content);
    v->content = NULL;
  }

  /* free ops and vector */
  if (v->ops != NULL)
  {
    free(v->ops);
    v->ops = NULL;
  }
  free(v);
  v = NULL;

  return;
}